

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

bool __thiscall glu::ES2ContextInfo::isFragmentDynamicLoopSupported(ES2ContextInfo *this)

{
  byte bVar1;
  
  if ((this->m_fragmentDynamicLoopsSupported).m_isComputed == true) {
    bVar1 = (this->m_fragmentDynamicLoopsSupported).m_value;
  }
  else {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_fragmentDynamicLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_fragmentDynamicLoopsSupported).m_value = (bool)bVar1;
    (this->m_fragmentDynamicLoopsSupported).m_isComputed = true;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool								isFragmentDynamicLoopSupported		(void) const	{ return m_fragmentDynamicLoopsSupported.getValue(m_context);	}